

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

void Luv24toLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint *puVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  double v;
  double u;
  double local_38;
  double local_30;
  
  if (0 < n) {
    puVar4 = (uint *)sp->tbuf;
    uVar3 = n + 1;
    do {
      uVar1 = *puVar4;
      *(ushort *)op = ((ushort)(uVar1 >> 0xc) & 0xffd) + 0x3402;
      iVar2 = uv_decode(&local_30,&local_38,uVar1 & 0x3fff);
      uVar5 = 0x3ca11af2;
      if (-1 < iVar2) {
        auVar6._0_4_ = (int)(local_30 * 32768.0);
        auVar6._4_4_ = (int)(local_38 * 32768.0);
        auVar6._8_8_ = 0;
        auVar6 = packssdw(auVar6,auVar6);
        uVar5 = auVar6._0_4_;
      }
      *(undefined4 *)((long)op + 2) = uVar5;
      puVar4 = puVar4 + 1;
      uVar3 = uVar3 - 1;
      op = (uint8_t *)((long)op + 6);
    } while (1 < uVar3);
  }
  return;
}

Assistant:

static void Luv24toLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        double u, v;

        *luv3++ = (int16_t)((*luv >> 12 & 0xffd) + 13314);
        if (uv_decode(&u, &v, *luv & 0x3fff) < 0)
        {
            u = U_NEU;
            v = V_NEU;
        }
        *luv3++ = (int16_t)(u * (1L << 15));
        *luv3++ = (int16_t)(v * (1L << 15));
        luv++;
    }
}